

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

unsafe_optional_ptr<const_Node> __thiscall
duckdb::ART::Lookup(ART *this,Node *node,ARTKey *key,idx_t depth)

{
  byte bVar1;
  optional_idx oVar2;
  ulong uVar3;
  reference<const_Node> ref;
  reference<const_duckdb::Node> local_38;
  idx_t local_30;
  
  uVar3 = (node->super_IndexPointer).data;
  if (uVar3 >> 0x38 != 0) {
    local_38._M_data = node;
    local_30 = depth;
    do {
      bVar1 = (byte)(uVar3 >> 0x38);
      if ((byte)((bVar1 & 0x7f) - 8) < 3) {
        return (unsafe_optional_ptr<const_Node>)local_38._M_data;
      }
      if (bVar1 < 0x82) {
        if (bVar1 == 2) {
          return (unsafe_optional_ptr<const_Node>)local_38._M_data;
        }
        if (bVar1 == 7) {
          return (unsafe_optional_ptr<const_Node>)local_38._M_data;
        }
      }
      else {
        if (bVar1 == 0x82) {
          return (unsafe_optional_ptr<const_Node>)local_38._M_data;
        }
        if (bVar1 == 0x87) {
          return (unsafe_optional_ptr<const_Node>)local_38._M_data;
        }
      }
      if ((long)uVar3 < 0) {
        return (unsafe_optional_ptr<const_Node>)local_38._M_data;
      }
      if ((bVar1 & 0x7f) == 1) {
        oVar2 = TraverseInternal<duckdb::Node_const>(this,&local_38,key,&local_30,false);
        if (oVar2.index != 0xffffffffffffffff) {
          return (unsafe_optional_ptr<const_Node>)(Node *)0x0;
        }
      }
      else {
        local_38._M_data =
             (Node *)GetChildInternal<duckdb::Node_const>(this,local_38._M_data,key->data[local_30])
        ;
        if (local_38._M_data == (Node *)0x0) {
          return (unsafe_optional_ptr<const_Node>)(Node *)0x0;
        }
        local_30 = local_30 + 1;
      }
      uVar3 = ((local_38._M_data)->super_IndexPointer).data;
    } while (0xffffffffffffff < uVar3);
  }
  return (unsafe_optional_ptr<const_Node>)(Node *)0x0;
}

Assistant:

const unsafe_optional_ptr<const Node> ART::Lookup(const Node &node, const ARTKey &key, idx_t depth) {
	reference<const Node> ref(node);
	while (ref.get().HasMetadata()) {

		// Return the leaf.
		if (ref.get().IsAnyLeaf() || ref.get().GetGateStatus() == GateStatus::GATE_SET) {
			return unsafe_optional_ptr<const Node>(ref.get());
		}

		// Traverse the prefix.
		if (ref.get().GetType() == NType::PREFIX) {
			auto pos = Prefix::Traverse(*this, ref, key, depth);
			if (pos.IsValid()) {
				// Prefix mismatch, return nullptr.
				return nullptr;
			}
			continue;
		}

		// Get the child node.
		D_ASSERT(depth < key.len);
		auto child = ref.get().GetChild(*this, key[depth]);

		// No child at the matching byte, return nullptr.
		if (!child) {
			return nullptr;
		}

		// Continue in the child.
		ref = *child;
		D_ASSERT(ref.get().HasMetadata());
		depth++;
	}

	return nullptr;
}